

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjWeakRefLookupTable::mark_refs(CVmObjWeakRefLookupTable *this,uint state)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  
  piVar3 = (int *)(this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
  iVar1 = *piVar3;
  piVar3 = piVar3 + 8;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, piVar2 = piVar3, bVar4) {
    for (; piVar2 = *(int **)piVar2, piVar2 != (int *)0x0; piVar2 = piVar2 + 8) {
      if (*piVar2 == 5) {
        CVmObjTable::add_to_gc_queue(&G_obj_table_X,piVar2[2],state);
      }
    }
    piVar3 = piVar3 + 2;
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::mark_refs(VMG_ uint state)
{
    vm_lookup_val **bp;
    uint i;

    /* note that the default value is weakly referenced, so don't mark it */

    /* run through my buckets */
    for (i = get_ext()->bucket_cnt, bp = get_ext()->buckets ;
         i != 0 ; --i, ++bp)
    {
        const vm_lookup_val *entry;

        /* run through all entries attached to this bucket */
        for (entry = *bp ; entry != 0 ; entry = entry->nxt)
        {
            /* if the key is an object, mark it as referenced */
            if (entry->key.typ == VM_OBJ)
                G_obj_table->mark_all_refs(entry->key.val.obj, state);

            /* 
             *   note that we only reference our value weakly, so do not
             *   mark it here 
             */
        }
    }
}